

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::push_back<int>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,int *val)

{
  byte bVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  allocator<char> local_31;
  string local_30;
  
  for (; bVar1 = *(byte *)&this->field_0 & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&this->field_0 + 8)) {
  }
  if (bVar1 == 0xe) {
    std::
    vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
    ::emplace_back<int>((vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                         *)(*(long *)((long)&this->field_0 + 8) + 8),val);
    return;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Attempting to insert into a value that is not an array",&local_31)
  ;
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_30);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

void push_back(T&& val)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().push_back(std::forward<T>(val));
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().push_back(std::forward<T>(val));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }